

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac.c
# Opt level: O1

int mac_method_hmac_sha2_512_hash
              (LIBSSH2_SESSION *session,uchar *buf,uint32_t seqno,uchar *packet,size_t packet_len,
              uchar *addtl,size_t addtl_len,void **abstract)

{
  void *key;
  HMAC_CTX *ctx;
  EVP_MD *md;
  uchar local_34 [4];
  
  _libssh2_htonu32(local_34,seqno);
  ctx = (HMAC_CTX *)HMAC_CTX_new();
  key = *abstract;
  md = EVP_sha512();
  HMAC_Init_ex(ctx,key,0x40,md,(ENGINE *)0x0);
  HMAC_Update(ctx,local_34,4);
  HMAC_Update(ctx,packet,packet_len);
  if (addtl_len != 0 && addtl != (uchar *)0x0) {
    HMAC_Update(ctx,addtl,addtl_len);
  }
  HMAC_Final(ctx,buf,(uint *)0x0);
  HMAC_CTX_free(ctx);
  return 0;
}

Assistant:

static int
mac_method_hmac_sha2_512_hash(LIBSSH2_SESSION * session,
                              unsigned char *buf, uint32_t seqno,
                              const unsigned char *packet,
                              size_t packet_len,
                              const unsigned char *addtl,
                              size_t addtl_len, void **abstract)
{
    libssh2_hmac_ctx ctx;
    unsigned char seqno_buf[4];
    (void)session;

    _libssh2_htonu32(seqno_buf, seqno);

    libssh2_hmac_ctx_init(ctx);
    libssh2_hmac_sha512_init(&ctx, *abstract, 64);
    libssh2_hmac_update(ctx, seqno_buf, 4);
    libssh2_hmac_update(ctx, packet, packet_len);
    if(addtl && addtl_len) {
        libssh2_hmac_update(ctx, addtl, addtl_len);
    }
    libssh2_hmac_final(ctx, buf);
    libssh2_hmac_cleanup(&ctx);

    return 0;
}